

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O1

void __thiscall
irr::video::CNullDriver::swapMaterialRenderers(CNullDriver *this,u32 idx1,u32 idx2,bool swapNames)

{
  IMaterialRenderer *pIVar1;
  uint uVar2;
  pointer pSVar3;
  pointer pSVar4;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  pSVar4 = (this->MaterialRenderers).m_data.
           super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = (int)((ulong)((long)(this->MaterialRenderers).m_data.
                              super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar4) >> 3) *
          -0x33333333;
  if (idx2 < uVar2 && idx1 < uVar2) {
    pIVar1 = pSVar4[idx1].Renderer;
    pSVar4[idx1].Renderer = pSVar4[idx2].Renderer;
    pSVar4[idx2].Renderer = pIVar1;
    if (swapNames) {
      pSVar4 = (this->MaterialRenderers).m_data.
               super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pSVar3 = pSVar4 + idx1;
      local_48 = 0;
      local_40._M_local_buf[0] = '\0';
      local_50._M_p = (pointer)&local_40;
      if ((pointer)&local_50 != pSVar3) {
        ::std::__cxx11::string::_M_assign((string *)&local_50);
      }
      pSVar4 = pSVar4 + idx2;
      if (idx1 != idx2) {
        ::std::__cxx11::string::_M_assign((string *)pSVar3);
      }
      if ((pointer)&local_50 != pSVar4) {
        ::std::__cxx11::string::_M_assign((string *)pSVar4);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_p != &local_40) {
        operator_delete(local_50._M_p,
                        CONCAT71(local_40._M_allocated_capacity._1_7_,local_40._M_local_buf[0]) + 1)
        ;
      }
    }
  }
  return;
}

Assistant:

void CNullDriver::swapMaterialRenderers(u32 idx1, u32 idx2, bool swapNames)
{
	if (idx1 < MaterialRenderers.size() && idx2 < MaterialRenderers.size()) {
		irr::core::swap(MaterialRenderers[idx1].Renderer, MaterialRenderers[idx2].Renderer);
		if (swapNames)
			irr::core::swap(MaterialRenderers[idx1].Name, MaterialRenderers[idx2].Name);
	}
}